

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  ushort uVar1;
  uint uVar2;
  HashElement *pHVar3;
  HashElement *pHVar4;
  RTPMemoryManager *pRVar5;
  int iVar6;
  HashElement *pHVar7;
  
  iVar6 = -0x5a;
  if (((this->init == true) && (iVar6 = -0x59, this->created == true)) &&
     (iVar6 = -0x54, addr->addresstype == IPv4Address)) {
    uVar1 = *(ushort *)&addr[1]._vptr_RTPAddress;
    uVar2 = *(uint *)&addr->field_0xc;
    pHVar7 = (this->destinations).table[uVar2 % 0x207d];
    (this->destinations).curhashelem = pHVar7;
    iVar6 = -5;
    if (pHVar7 != (HashElement *)0x0) {
      do {
        if (((pHVar7->element).rtpaddr.sin_addr.s_addr ==
             (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)) &&
           ((pHVar7->element).rtpaddr.sin_port == (in_port_t)(uVar1 << 8 | uVar1 >> 8))) {
          pHVar3 = pHVar7->hashprev;
          pHVar4 = pHVar7->hashnext;
          if (pHVar3 == (HashElement *)0x0) {
            (this->destinations).table[pHVar7->hashindex] = pHVar4;
          }
          else {
            pHVar3->hashnext = pHVar4;
          }
          if (pHVar4 != (HashElement *)0x0) {
            pHVar4->hashprev = pHVar3;
          }
          pHVar7 = (this->destinations).curhashelem;
          pHVar3 = pHVar7->listprev;
          pHVar4 = pHVar7->listnext;
          if (pHVar3 == (HashElement *)0x0) {
            (this->destinations).firsthashelem = pHVar4;
            if (pHVar4 == (HashElement *)0x0) {
              (this->destinations).lasthashelem = (HashElement *)0x0;
            }
            else {
              pHVar4->listprev = (HashElement *)0x0;
            }
          }
          else {
            pHVar3->listnext = pHVar4;
            if (pHVar4 == (HashElement *)0x0) {
              (this->destinations).lasthashelem = pHVar3;
            }
            else {
              pHVar4->listprev = pHVar3;
            }
          }
          pRVar5 = (this->destinations).super_RTPMemoryObject.mgr;
          if (pRVar5 == (RTPMemoryManager *)0x0) {
            operator_delete(pHVar7,0x48);
          }
          else {
            (*pRVar5->_vptr_RTPMemoryManager[3])(pRVar5,pHVar7);
          }
          (this->destinations).curhashelem = pHVar4;
          return 0;
        }
        pHVar7 = pHVar7->hashnext;
        (this->destinations).curhashelem = pHVar7;
      } while (pHVar7 != (HashElement *)0x0);
    }
  }
  return iVar6;
}

Assistant:

int RTPUDPv4Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}